

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidgetPrivate::releaseResources(QRhiWidgetPrivate *this)

{
  resetRenderTargetObjects(this);
  resetColorBufferObjects(this);
  qDeleteAll<QList<QRhiResource*>>(&this->pendingDeletes);
  QList<QRhiResource_*>::clear(&this->pendingDeletes);
  return;
}

Assistant:

void QRhiWidgetPrivate::releaseResources()
{
    resetRenderTargetObjects();
    resetColorBufferObjects();
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();
}